

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsestream.h
# Opt level: O3

Vec3fa __thiscall embree::ParseStream::getVec3fa(ParseStream *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  RefCount RVar5;
  _Alloc_hider _Var6;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RSI;
  Vec3fa VVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_40,in_RSI);
  _Var6._M_p = local_40._M_dataplus._M_p;
  dVar2 = atof(local_40._M_dataplus._M_p);
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p != paVar1) {
    operator_delete(_Var6._M_p);
  }
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_40,in_RSI);
  _Var6._M_p = local_40._M_dataplus._M_p;
  dVar3 = atof(local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p != paVar1) {
    operator_delete(_Var6._M_p);
  }
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_40,in_RSI);
  dVar4 = atof(local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  VVar7.field_0._0_4_ = (float)dVar3;
  VVar7.field_0._4_4_ = (float)dVar4;
  VVar7.field_0._8_4_ = (float)dVar2;
  RVar5._vptr_RefCount._4_4_ = VVar7.field_0._0_4_;
  RVar5._vptr_RefCount._0_4_ = VVar7.field_0._8_4_;
  RVar5.refCounter.super___atomic_base<unsigned_long>._M_i._0_4_ = VVar7.field_0._4_4_;
  RVar5.refCounter.super___atomic_base<unsigned_long>._M_i._4_4_ = 0;
  (this->
  super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_RefCount = RVar5;
  VVar7.field_0.m128[3] = 0.0;
  return (Vec3fa)VVar7.field_0;
}

Assistant:

Vec3fa getVec3fa() {
      float x = (float)atof(get().c_str());
      float y = (float)atof(get().c_str());
      float z = (float)atof(get().c_str());
      return Vec3fa(x,y,z);
    }